

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddstexture.cpp
# Opt level: O1

void __thiscall
FDDSTexture::DecompressDXT3(FDDSTexture *this,FWadLump *lump,bool premultiplied,BYTE *tcbuf)

{
  undefined1 *puVar1;
  byte bVar2;
  ushort uVar3;
  byte bVar4;
  long lVar5;
  BYTE BVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  void *pvVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  PalEntry color [4];
  WORD color16 [2];
  BYTE palcol [4];
  byte local_78 [8];
  undefined1 local_70;
  undefined1 local_6f;
  undefined1 local_6e;
  undefined1 local_6c;
  undefined1 local_6b;
  undefined1 local_6a;
  ushort local_5c [2];
  ulong local_58;
  void *local_50;
  BYTE aBStack_44 [4];
  ulong local_40;
  FWadLump *local_38;
  
  local_40 = (ulong)((uint)(this->super_FTexture).Width * 4 + 0xc & 0xfffffff0);
  local_38 = lump;
  local_50 = operator_new__(local_40);
  if ((this->super_FTexture).Height != 0) {
    local_58 = 0;
    do {
      (*(local_38->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
                (local_38,local_50,local_40);
      if ((this->super_FTexture).Width != 0) {
        uVar14 = 0;
        pvVar10 = local_50;
        do {
          local_5c[0] = *(ushort *)((long)pvVar10 + 8);
          local_5c[1] = *(undefined2 *)((long)pvVar10 + 10);
          lVar5 = 1;
          do {
            uVar3 = local_5c[lVar5];
            bVar2 = (byte)(uVar3 >> 8);
            local_78[lVar5 * 4 + 2] = (bVar2 >> 5) + (bVar2 & 0xf8);
            local_78[lVar5 * 4 + 1] = bVar2 >> 1 & 3 | (byte)(uVar3 >> 3) & 0xfc;
            local_78[lVar5 * 4] = ((byte)(uVar3 >> 2) & 7) + (char)uVar3 * '\b';
            bVar15 = lVar5 != 0;
            lVar5 = lVar5 + -1;
          } while (bVar15);
          local_6e = (char)(((uint)local_78[6] + (uint)local_78[2] * 2 + 1) / 3);
          local_6f = (char)(((uint)local_78[5] + (uint)local_78[1] * 2 + 1) / 3);
          local_70 = (char)(((uint)local_78[4] + (uint)local_78[0] * 2 + 1) / 3);
          local_6a = (char)(((uint)local_78[2] + (uint)local_78[6] * 2 + 1) / 3);
          local_6b = (char)(((uint)local_78[1] + (uint)local_78[5] * 2 + 1) / 3);
          local_6c = (char)(((uint)local_78[0] + (uint)local_78[4] * 2 + 1) / 3);
          if (tcbuf == (BYTE *)0x0) {
            lVar5 = 3;
            do {
              aBStack_44[lVar5] =
                   RGB32k.All
                   [(ulong)(local_78[lVar5 * 4] >> 3) +
                    (ulong)(local_78[lVar5 * 4 + 1] & 0xfffffff8) * 4 +
                    (ulong)((local_78[lVar5 * 4 + 2] & 0xf8) << 7)];
              bVar15 = lVar5 != 0;
              lVar5 = lVar5 + -1;
            } while (bVar15);
          }
          uVar11 = local_58 & 0xffffffff;
          uVar12 = 0;
          do {
            if ((ulong)(this->super_FTexture).Height <= (uVar12 | local_58)) break;
            bVar2 = *(byte *)((long)pvVar10 + uVar12 + 0xc);
            uVar3 = *(ushort *)((long)pvVar10 + uVar12 * 2);
            bVar4 = 0;
            iVar7 = 0;
            uVar8 = uVar14;
            do {
              uVar9 = (uint)uVar8;
              uVar13 = (uint)(this->super_FTexture).Width;
              if (uVar13 <= uVar9) break;
              if (tcbuf == (BYTE *)0x0) {
                if ((uVar3 >> (bVar4 & 0x1f) & 8) == 0) {
                  puVar1 = &(this->super_FTexture).field_0x31;
                  *puVar1 = *puVar1 | 8;
                  BVar6 = '\0';
                }
                else {
                  BVar6 = aBStack_44[bVar2 >> ((byte)iVar7 & 0x1f) & 3];
                }
                this->Pixels[uVar8 * (this->super_FTexture).Height + (uVar12 | local_58)] = BVar6;
              }
              else {
                lVar5 = (long)(int)((uVar13 * (int)uVar11 + uVar9) * 4);
                uVar8 = (ulong)(bVar2 >> ((byte)iVar7 & 0x1f) & 3);
                tcbuf[lVar5] = local_78[uVar8 * 4 + 2];
                tcbuf[lVar5 + 1] = local_78[uVar8 * 4 + 1];
                tcbuf[lVar5 + 2] = local_78[uVar8 * 4];
                tcbuf[lVar5 + 3] = local_78[uVar8 * 4 + 3];
              }
              iVar7 = iVar7 + 2;
              uVar8 = (ulong)(uVar9 + 1);
              bVar4 = bVar4 + 4;
            } while (iVar7 != 8);
            uVar12 = uVar12 + 1;
            uVar11 = (ulong)((int)uVar11 + 1);
          } while (uVar12 != 4);
          pvVar10 = (void *)((long)pvVar10 + 0x10);
          uVar13 = (int)uVar14 + 4;
          uVar14 = (ulong)uVar13;
        } while (uVar13 < (this->super_FTexture).Width);
      }
      local_58 = local_58 + 4;
    } while (local_58 < (this->super_FTexture).Height);
  }
  operator_delete__(local_50);
  return;
}

Assistant:

void FDDSTexture::DecompressDXT3 (FWadLump &lump, bool premultiplied, BYTE *tcbuf)
{
	const long blocklinelen = ((Width + 3) >> 2) << 4;
	BYTE *blockbuff = new BYTE[blocklinelen];
	BYTE *block;
	PalEntry color[4];
	BYTE palcol[4];
	int ox, oy, x, y, i;

	for (oy = 0; oy < Height; oy += 4)
	{
		lump.Read (blockbuff, blocklinelen);
		block = blockbuff;
		for (ox = 0; ox < Width; ox += 4)
		{
			WORD color16[2] = { LittleShort(((WORD *)block)[4]), LittleShort(((WORD *)block)[5]) };

			// Convert color from R5G6B5 to R8G8B8.
			for (i = 1; i >= 0; --i)
			{
				color[i].r = ((color16[i] & 0xF800) >> 8) | (color16[i] >> 13);
				color[i].g = ((color16[i] & 0x07E0) >> 3) | ((color16[i] & 0x0600) >> 9);
				color[i].b = ((color16[i] & 0x001F) << 3) | ((color16[i] & 0x001C) >> 2);
			}
			// Derive the other two colors.
			color[2].r = (color[0].r + color[0].r + color[1].r + 1) / 3;
			color[2].g = (color[0].g + color[0].g + color[1].g + 1) / 3;
			color[2].b = (color[0].b + color[0].b + color[1].b + 1) / 3;

			color[3].r = (color[0].r + color[1].r + color[1].r + 1) / 3;
			color[3].g = (color[0].g + color[1].g + color[1].g + 1) / 3;
			color[3].b = (color[0].b + color[1].b + color[1].b + 1) / 3;

			// Pick colors from the palette for each of the four colors.
			if (!tcbuf) for (i = 3; i >= 0; --i)
			{
				palcol[i] = RGB32k.RGB[color[i].r >> 3][color[i].g >> 3][color[i].b >> 3];
			}
			// Now decode this 4x4 block to the pixel buffer.
			for (y = 0; y < 4; ++y)
			{
				if (oy + y >= Height)
				{
					break;
				}
				BYTE yslice = block[12 + y];
				WORD yalphaslice = LittleShort(((WORD *)block)[y]);
				for (x = 0; x < 4; ++x)
				{
					if (ox + x >= Width)
					{
						break;
					}
					if (!tcbuf)
					{
						Pixels[oy + y + (ox + x) * Height] = ((yalphaslice >> (x*4)) & 15) < 8 ?
							(bMasked = true, 0) : palcol[(yslice >> (x + x)) & 3];
					}
					else
					{
						BYTE * tcp = &tcbuf[(ox + x)*4 + (oy + y) * Width*4];
						int c = (yslice >> (x + x)) & 3;
						tcp[0] = color[c].r;
						tcp[1] = color[c].g;
						tcp[2] = color[c].b;
						tcp[3] = color[c].a;
					}
				}
			}
			block += 16;
		}
	}
	delete[] blockbuff;
}